

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O2

pair<char,_int> *
eastl::
lower_bound<eastl::pair<char,int>const*,char,eastl::detail::compare_impl<eastl::pair<char,int>,eastl::less<char>>>
          (pair<char,_int> *first,long last,char *value)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = last - (long)first >> 3;
  while (0 < (long)uVar2) {
    uVar1 = uVar2 >> 1;
    uVar3 = ~uVar1 + uVar2;
    uVar2 = uVar1;
    if (first[uVar1].first < *value) {
      first = first + uVar1 + 1;
      uVar2 = uVar3;
    }
  }
  return first;
}

Assistant:

ForwardIterator
    lower_bound(ForwardIterator first, ForwardIterator last, const T& value, Compare compare)
    {
        typedef typename eastl::iterator_traits<ForwardIterator>::difference_type DifferenceType;

        DifferenceType d = eastl::distance(first, last); // This will be efficient for a random access iterator such as an array.

        while(d > 0)
        {
            ForwardIterator i  = first;
            DifferenceType  d2 = d >> 1; // We use '>>1' here instead of '/2' because MSVC++ for some reason generates significantly worse code for '/2'. Go figure.

            eastl::advance(i, d2); // This will be efficient for a random access iterator such as an array.

            if(compare(*i, value))
            {
                // Disabled because std::lower_bound doesn't specify (23.3.3.1, p3) this can be done: EASTL_VALIDATE_COMPARE(!compare(value, *i)); // Validate that the compare function is sane.
                first = ++i;
                d    -= d2 + 1;
            }
            else
                d = d2;
        }
        return first;
    }